

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O2

void __thiscall
cbtGImpactMeshShape::calculateLocalInertia
          (cbtGImpactMeshShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  int iVar1;
  cbtGImpactMeshShapePart *pcVar2;
  long lVar3;
  bool bVar4;
  cbtVector3 partinertia;
  cbtVector3 local_30;
  
  inertia->m_floats[0] = 0.0;
  inertia->m_floats[1] = 0.0;
  inertia->m_floats[2] = 0.0;
  inertia->m_floats[3] = 0.0;
  iVar1 = (this->m_mesh_parts).m_size;
  lVar3 = (long)iVar1;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    pcVar2 = (this->m_mesh_parts).m_data[lVar3];
    (*(pcVar2->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[8])((ulong)(uint)(mass / (float)iVar1),pcVar2,&local_30);
    cbtVector3::operator+=(inertia,&local_30);
  }
  return;
}

Assistant:

void cbtGImpactMeshShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
#ifdef CALC_EXACT_INERTIA
	inertia.setValue(0.f, 0.f, 0.f);

	int i = this->getMeshPartCount();
	cbtScalar partmass = mass / cbtScalar(i);

	while (i--)
	{
		cbtVector3 partinertia;
		getMeshPart(i)->calculateLocalInertia(partmass, partinertia);
		inertia += partinertia;
	}

#else

	// Calc box inertia

	cbtScalar lx = m_localAABB.m_max[0] - m_localAABB.m_min[0];
	cbtScalar ly = m_localAABB.m_max[1] - m_localAABB.m_min[1];
	cbtScalar lz = m_localAABB.m_max[2] - m_localAABB.m_min[2];
	const cbtScalar x2 = lx * lx;
	const cbtScalar y2 = ly * ly;
	const cbtScalar z2 = lz * lz;
	const cbtScalar scaledmass = mass * cbtScalar(0.08333333);

	inertia = scaledmass * (cbtVector3(y2 + z2, x2 + z2, x2 + y2));

#endif
}